

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Structure * fts5StructureReadUncached(Fts5Index *p)

{
  int iVar1;
  Fts5Data *pData_00;
  Fts5Data *pData;
  Fts5Config *pFStack_20;
  int iCookie;
  Fts5Config *pConfig;
  Fts5Structure *pRet;
  Fts5Index *p_local;
  
  pConfig = (Fts5Config *)0x0;
  pFStack_20 = p->pConfig;
  pRet = (Fts5Structure *)p;
  pData_00 = fts5DataRead(p,10);
  if (*(int *)((long)&pRet[1].nWriteCounter + 4) == 0) {
    memset(pData_00->p + pData_00->nn,0,0x14);
    iVar1 = fts5StructureDecode(pData_00->p,pData_00->nn,(int *)((long)&pData + 4),
                                (Fts5Structure **)&pConfig);
    *(int *)((long)&pRet[1].nWriteCounter + 4) = iVar1;
    if ((*(int *)((long)&pRet[1].nWriteCounter + 4) == 0) && (pFStack_20->iCookie != pData._4_4_)) {
      iVar1 = sqlite3Fts5ConfigLoad(pFStack_20,pData._4_4_);
      *(int *)((long)&pRet[1].nWriteCounter + 4) = iVar1;
    }
    fts5DataRelease(pData_00);
    if (*(int *)((long)&pRet[1].nWriteCounter + 4) != 0) {
      fts5StructureRelease((Fts5Structure *)pConfig);
      pConfig = (Fts5Config *)0x0;
    }
  }
  return (Fts5Structure *)pConfig;
}

Assistant:

static Fts5Structure *fts5StructureReadUncached(Fts5Index *p){
  Fts5Structure *pRet = 0;
  Fts5Config *pConfig = p->pConfig;
  int iCookie;                    /* Configuration cookie */
  Fts5Data *pData;

  pData = fts5DataRead(p, FTS5_STRUCTURE_ROWID);
  if( p->rc==SQLITE_OK ){
    /* TODO: Do we need this if the leaf-index is appended? Probably... */
    memset(&pData->p[pData->nn], 0, FTS5_DATA_PADDING);
    p->rc = fts5StructureDecode(pData->p, pData->nn, &iCookie, &pRet);
    if( p->rc==SQLITE_OK && pConfig->iCookie!=iCookie ){
      p->rc = sqlite3Fts5ConfigLoad(pConfig, iCookie);
    }
    fts5DataRelease(pData);
    if( p->rc!=SQLITE_OK ){
      fts5StructureRelease(pRet);
      pRet = 0;
    }
  }

  return pRet;
}